

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

void init_cache(cache *Cache,int record_length,int max_size,double filling_factor,realse_data realse
               ,add_data add,add_multi_data add_multi,check_data check,get_data_label get_label)

{
  int size;
  undefined1 auVar1 [16];
  record *prVar2;
  uint *puVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int j;
  size_t __nmemb;
  int iVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  long lVar12;
  
  Cache->first = -1;
  Cache->last = -1;
  __nmemb = 1000;
  if (0 < record_length) {
    __nmemb = (size_t)(uint)record_length;
  }
  Cache->max_length = __nmemb;
  size = (int)__nmemb;
  prVar2 = (record *)calloc((ulong)(size + 1),0x18);
  Cache->records = prVar2;
  puVar3 = (uint *)calloc(__nmemb,4);
  uVar4 = 0x19000;
  if (0 < max_size) {
    uVar4 = (ulong)(uint)max_size;
  }
  Cache->stack = puVar3;
  Cache->max_size = uVar4;
  prVar2->next = -1;
  prVar2->last = -1;
  prVar2->valid = true;
  iVar6 = 0;
  log_log(2,"/workspace/llm4binary/github/license_all_cmakelists_25/ruiqurm[P]bupt_dns/src/cache.c",
          0x5e,"record_length:%d");
  auVar1 = _DAT_00103150;
  puVar3 = Cache->stack;
  lVar12 = __nmemb - 1;
  auVar9._8_4_ = (int)lVar12;
  auVar9._0_8_ = lVar12;
  auVar9._12_4_ = (int)((ulong)lVar12 >> 0x20);
  iVar5 = -3;
  iVar7 = -2;
  iVar8 = -1;
  auVar9 = auVar9 ^ _DAT_00103150;
  uVar4 = 0;
  auVar11 = _DAT_00103130;
  auVar13 = _DAT_00103140;
  do {
    auVar14 = auVar13 ^ auVar1;
    iVar10 = auVar9._4_4_;
    if ((bool)(~(auVar14._4_4_ == iVar10 && auVar9._0_4_ < auVar14._0_4_ || iVar10 < auVar14._4_4_)
              & 1)) {
      puVar3[uVar4] = iVar6 + size;
    }
    if ((auVar14._12_4_ != auVar9._12_4_ || auVar14._8_4_ <= auVar9._8_4_) &&
        auVar14._12_4_ <= auVar9._12_4_) {
      puVar3[uVar4 + 1] = iVar8 + size;
    }
    auVar14 = auVar11 ^ auVar1;
    iVar15 = auVar14._4_4_;
    if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar14._0_4_ <= auVar9._0_4_)) {
      puVar3[uVar4 + 2] = iVar7 + size;
      puVar3[uVar4 + 3] = iVar5 + size;
    }
    uVar4 = uVar4 + 4;
    lVar12 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 4;
    auVar13._8_8_ = lVar12 + 4;
    lVar12 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 4;
    auVar11._8_8_ = lVar12 + 4;
    iVar6 = iVar6 + -4;
    iVar5 = iVar5 + -4;
    iVar7 = iVar7 + -4;
    iVar8 = iVar8 + -4;
  } while ((size + 3U & 0xfffffffc) != uVar4);
  Cache->stack_top = size + -1;
  Cache->used_size = 0;
  Cache->length = 0;
  init_hashtable(&Cache->label_hash,size,
                 (double)(-(ulong)(filling_factor <= 0.0) & 0x3fe6666666666666 |
                         ~-(ulong)(filling_factor <= 0.0) &
                         (~-(ulong)(1.0 < filling_factor) & (ulong)filling_factor |
                         -(ulong)(1.0 < filling_factor) & 0x3fe6666666666666)),_hash_label,
                 compare_record_with_label);
  Cache->add = add;
  Cache->realse = realse;
  Cache->add_multi = add_multi;
  Cache->check = check;
  Cache->get_label = get_label;
  Cache->is_init = true;
  pthread_mutex_init((pthread_mutex_t *)&Cache->lock,(pthread_mutexattr_t *)0x0);
  return;
}

Assistant:

void init_cache(cache*Cache,int record_length,int max_size,double filling_factor,
               realse_data realse,add_data add,add_multi_data add_multi,
               check_data check,get_data_label get_label){
  //初始化函数
  Cache->first = Cache->last = -1;
  
  if(record_length<=0)record_length = LRU_BUFFER_LENGTH; 
  Cache->max_length = record_length;

  Cache->records = (struct record*)calloc(record_length+1,sizeof(struct record));
  Cache->stack = (unsigned*)calloc(record_length,sizeof(unsigned));

  if(max_size<=0)max_size = CACHE_SIZE;
  Cache->max_size = max_size;

  Cache->records[LRU_BUFFER_HEAD_POINT].last = -1;
  Cache->records[LRU_BUFFER_HEAD_POINT].next = -1;
  Cache->records[LRU_BUFFER_HEAD_POINT].valid = 1; //头结点
  log_info("record_length:%d",record_length);
  for (int i = 0, j = record_length; i < record_length;
       i++, j--) {
    Cache->stack[i] = j; // 1~MAX 都是可用的 0是头结点
  }
  Cache->stack_top = record_length - 1;
  Cache->used_size = 0;
  Cache->length = 0;
  if(filling_factor<=0||filling_factor>1)filling_factor = CACHE_FILLING_FACTOR;
  init_hashtable(&Cache->label_hash,record_length,filling_factor,_hash_label,compare_record_with_label);
  Cache->add = add;
  Cache->realse =realse;
  Cache->add_multi = add_multi;
  Cache->check = check;
  Cache->get_label =get_label;
  Cache->is_init = true;
  pthread_mutex_init(&Cache->lock,NULL);//初始化锁
}